

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O3

void Fxu_MatrixGetDoubleVars
               (Fxu_Matrix *p,Fxu_Double *pDouble,int *piVarsC1,int *piVarsC2,int *pnVarsC1,
               int *pnVarsC2)

{
  int iVar1;
  int iVar2;
  Fxu_Pair *pFVar3;
  int iVar4;
  ulong uVar5;
  Fxu_Lit *pFVar6;
  Fxu_ListLit *pFVar7;
  Fxu_Lit *pFVar8;
  
  pFVar3 = (pDouble->lPairs).pHead;
  pFVar7 = &pFVar3->pCube1->lLits;
  pFVar6 = (pFVar3->pCube2->lLits).pHead;
  iVar4 = 0;
  uVar5 = 0;
  do {
    pFVar8 = pFVar7->pHead;
    while( true ) {
      uVar5 = (ulong)(int)uVar5;
      for (; (pFVar8 != (Fxu_Lit *)0x0 && (pFVar6 != (Fxu_Lit *)0x0)); pFVar6 = pFVar6->pHNext) {
        iVar1 = pFVar8->iVar;
        iVar2 = pFVar6->iVar;
        if (iVar1 == iVar2) {
          pFVar8 = pFVar8->pHNext;
          goto LAB_0044458d;
        }
        if (iVar1 < iVar2) {
          piVarsC1[iVar4] = iVar1;
          goto LAB_0044459a;
        }
        piVarsC2[uVar5] = iVar2;
        uVar5 = uVar5 + 1;
      }
      if ((pFVar8 != (Fxu_Lit *)0x0) && (pFVar6 == (Fxu_Lit *)0x0)) break;
      if ((pFVar8 != (Fxu_Lit *)0x0) || (pFVar6 == (Fxu_Lit *)0x0)) {
        *pnVarsC1 = iVar4;
        *pnVarsC2 = (int)uVar5;
        return;
      }
      piVarsC2[uVar5] = pFVar6->iVar;
      uVar5 = (ulong)((int)uVar5 + 1);
      pFVar8 = (Fxu_Lit *)0x0;
LAB_0044458d:
      pFVar6 = pFVar6->pHNext;
    }
    piVarsC1[iVar4] = pFVar8->iVar;
    pFVar6 = (Fxu_Lit *)0x0;
LAB_0044459a:
    iVar4 = iVar4 + 1;
    pFVar7 = (Fxu_ListLit *)&pFVar8->pHNext;
  } while( true );
}

Assistant:

void Fxu_MatrixGetDoubleVars( Fxu_Matrix * p, Fxu_Double * pDouble, 
    int piVarsC1[], int piVarsC2[], int * pnVarsC1, int * pnVarsC2 )
{
    Fxu_Pair * pPair;
	Fxu_Lit * pLit1, * pLit2;
    int nLits1, nLits2;

    // get the first pair
    pPair = pDouble->lPairs.pHead;
    // init the parameters
	nLits1 = 0;
	nLits2 = 0;
	pLit1 = pPair->pCube1->lLits.pHead;
	pLit2 = pPair->pCube2->lLits.pHead;
	while ( 1 )
	{
		if ( pLit1 && pLit2 )
		{
			if ( pLit1->iVar == pLit2->iVar )
			{ // ensure cube-free
				pLit1 = pLit1->pHNext;
				pLit2 = pLit2->pHNext;
			}
			else if ( pLit1->iVar < pLit2->iVar )
            {
                piVarsC1[nLits1++] = pLit1->iVar;
 				pLit1 = pLit1->pHNext;
           }
			else
            {
                piVarsC2[nLits2++] = pLit2->iVar;
				pLit2 = pLit2->pHNext;
            }
		}
		else if ( pLit1 && !pLit2 )
        {
            piVarsC1[nLits1++] = pLit1->iVar;
    		pLit1 = pLit1->pHNext;
        }
		else if ( !pLit1 && pLit2 )
        {
            piVarsC2[nLits2++] = pLit2->iVar;
			pLit2 = pLit2->pHNext;
        }
		else
			break;
	}
    *pnVarsC1 = nLits1;
    *pnVarsC2 = nLits2;
}